

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O2

void __thiscall
cmDebugger::cmDebuggerAdapter::OnBeginFunctionCall
          (cmDebuggerAdapter *this,cmMakefile *mf,string *sourcePath,cmListFileFunction *lff)

{
  long line;
  pointer plVar1;
  pointer plVar2;
  element_type *peVar3;
  pointer piVar4;
  vector<long,_std::allocator<long>_> hits;
  unique_lock<std::mutex> lock;
  array<dap::integer> hitBreakpoints;
  _Vector_base<long,_std::allocator<long>_> local_120;
  unique_lock<std::mutex> local_108;
  _Vector_base<dap::integer,_std::allocator<dap::integer>_> local_f8;
  undefined1 local_d8 [48];
  pointer local_a8;
  undefined1 uStack_a0;
  undefined7 uStack_9f;
  undefined1 uStack_98;
  undefined8 uStack_97;
  optional<dap::boolean> local_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  bool local_40;
  integer local_38;
  bool local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_108,&this->Mutex);
  cmDebuggerThread::PushStackFrame
            ((this->DefaultThread).
             super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr,mf,
             sourcePath,lff);
  line = ((lff->Impl).
          super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->Line;
  if (line == 0) goto LAB_003d3135;
  cmDebuggerBreakpointManager::GetBreakpoints
            ((vector<long,_std::allocator<long>_> *)&local_120,
             (this->BreakpointManager)._M_t.
             super___uniq_ptr_impl<cmDebugger::cmDebuggerBreakpointManager,_std::default_delete<cmDebugger::cmDebuggerBreakpointManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDebugger::cmDebuggerBreakpointManager_*,_std::default_delete<cmDebugger::cmDebuggerBreakpointManager>_>
             .super__Head_base<0UL,_cmDebugger::cmDebuggerBreakpointManager_*,_false>._M_head_impl,
             sourcePath,line);
  std::unique_lock<std::mutex>::unlock(&local_108);
  plVar2 = local_120._M_impl.super__Vector_impl_data._M_finish;
  plVar1 = local_120._M_impl.super__Vector_impl_data._M_start;
  local_d8._8_8_ = local_d8 + 0x18;
  local_d8._16_8_ = 0;
  local_d8[0x18] = '\0';
  local_d8[0x28] = false;
  local_a8 = (pointer)0x0;
  uStack_a0 = 0;
  uStack_9f = 0;
  uStack_98 = 0;
  uStack_97 = 0;
  local_88.val.val = false;
  local_88.set = false;
  local_80._M_p = (pointer)&local_70;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = false;
  local_d8[0] = true;
  local_d8[1] = true;
  peVar3 = (this->DefaultThread).
           super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.val = peVar3->Id;
  local_30 = true;
  if (local_120._M_impl.super__Vector_impl_data._M_start !=
      local_120._M_impl.super__Vector_impl_data._M_finish) {
    LOCK();
    (this->NextStepFrom).super___atomic_base<long>._M_i = -0x80000000;
    UNLOCK();
    LOCK();
    (this->StepInRequest)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->StepOutDepth).super___atomic_base<long>._M_i = -0x80000000;
    UNLOCK();
    LOCK();
    (this->PauseRequest)._M_base._M_i = false;
    UNLOCK();
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<dap::integer,_std::allocator<dap::integer>_>::resize
              ((vector<dap::integer,_std::allocator<dap::integer>_> *)&local_f8,
               (long)local_120._M_impl.super__Vector_impl_data._M_finish -
               (long)local_120._M_impl.super__Vector_impl_data._M_start >> 3);
    piVar4 = local_f8._M_impl.super__Vector_impl_data._M_start;
    for (; local_120._M_impl.super__Vector_impl_data._M_start !=
           local_120._M_impl.super__Vector_impl_data._M_finish;
        local_120._M_impl.super__Vector_impl_data._M_start =
             local_120._M_impl.super__Vector_impl_data._M_start + 1) {
      piVar4->val = *local_120._M_impl.super__Vector_impl_data._M_start;
      piVar4 = piVar4 + 1;
    }
    std::__cxx11::string::assign((char *)&local_80);
    dap::optional<std::vector<dap::integer,std::allocator<dap::integer>>>::operator=
              ((optional<std::vector<dap::integer,std::allocator<dap::integer>>> *)&local_a8,
               (vector<dap::integer,_std::allocator<dap::integer>_> *)&local_f8);
    std::_Vector_base<dap::integer,_std::allocator<dap::integer>_>::~_Vector_base(&local_f8);
    peVar3 = (this->DefaultThread).
             super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((((this->NextStepFrom).super___atomic_base<long>._M_i <
        (long)(peVar3->Frames).
              super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(peVar3->Frames).
              super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4) &&
      (((this->StepInRequest)._M_base._M_i & 1U) == 0)) &&
     (peVar3 = (this->DefaultThread).
               super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     (this->StepOutDepth).super___atomic_base<long>._M_i <
     (long)(peVar3->Frames).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
           ._M_impl.super__Vector_impl_data._M_finish -
     (long)(peVar3->Frames).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
           ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    if (((this->PauseRequest)._M_base._M_i & 1U) != 0) {
LAB_003d30d2:
      LOCK();
      (this->NextStepFrom).super___atomic_base<long>._M_i = -0x80000000;
      UNLOCK();
      LOCK();
      (this->StepInRequest)._M_base._M_i = false;
      UNLOCK();
      LOCK();
      (this->StepOutDepth).super___atomic_base<long>._M_i = -0x80000000;
      UNLOCK();
      LOCK();
      (this->PauseRequest)._M_base._M_i = false;
      UNLOCK();
      std::__cxx11::string::assign((char *)&local_80);
      goto LAB_003d310a;
    }
    if (plVar1 != plVar2) goto LAB_003d310a;
  }
  else {
    LOCK();
    (this->NextStepFrom).super___atomic_base<long>._M_i = -0x80000000;
    UNLOCK();
    LOCK();
    (this->StepInRequest)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->StepOutDepth).super___atomic_base<long>._M_i = -0x80000000;
    UNLOCK();
    LOCK();
    (this->PauseRequest)._M_base._M_i = false;
    UNLOCK();
    std::__cxx11::string::assign((char *)&local_80);
    if (((this->PauseRequest)._M_base._M_i & 1U) != 0) goto LAB_003d30d2;
LAB_003d310a:
    dap::Session::send<dap::StoppedEvent,void>
              ((this->Session)._M_t.
               super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
               super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
               super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl,(StoppedEvent *)local_d8);
    Semaphore::Wait((this->ContinueSem)._M_t.
                    super___uniq_ptr_impl<cmDebugger::Semaphore,_std::default_delete<cmDebugger::Semaphore>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmDebugger::Semaphore_*,_std::default_delete<cmDebugger::Semaphore>_>
                    .super__Head_base<0UL,_cmDebugger::Semaphore_*,_false>._M_head_impl);
  }
  dap::StoppedEvent::~StoppedEvent((StoppedEvent *)local_d8);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_120);
LAB_003d3135:
  std::unique_lock<std::mutex>::~unique_lock(&local_108);
  return;
}

Assistant:

void cmDebuggerAdapter::OnBeginFunctionCall(cmMakefile* mf,
                                            std::string const& sourcePath,
                                            cmListFileFunction const& lff)
{
  std::unique_lock<std::mutex> lock(Mutex);
  DefaultThread->PushStackFrame(mf, sourcePath, lff);

  if (lff.Line() == 0) {
    // File just loaded, continue to first valid function call.
    return;
  }

  auto hits = BreakpointManager->GetBreakpoints(sourcePath, lff.Line());
  lock.unlock();

  bool waitSem = false;
  dap::StoppedEvent stoppedEvent;
  stoppedEvent.allThreadsStopped = true;
  stoppedEvent.threadId = DefaultThread->GetId();
  if (!hits.empty()) {
    ClearStepRequests();
    waitSem = true;

    dap::array<dap::integer> hitBreakpoints;
    hitBreakpoints.resize(hits.size());
    std::transform(hits.begin(), hits.end(), hitBreakpoints.begin(),
                   [&](const int64_t& id) { return dap::integer(id); });
    stoppedEvent.reason = "breakpoint";
    stoppedEvent.hitBreakpointIds = hitBreakpoints;
  }

  if (long(DefaultThread->GetStackFrameSize()) <= NextStepFrom.load() ||
      StepInRequest.load() ||
      long(DefaultThread->GetStackFrameSize()) <= StepOutDepth.load()) {
    ClearStepRequests();
    waitSem = true;

    stoppedEvent.reason = "step";
  }

  if (PauseRequest.load()) {
    ClearStepRequests();
    waitSem = true;

    stoppedEvent.reason = "pause";
  }

  if (waitSem) {
    Session->send(stoppedEvent);
    ContinueSem->Wait();
  }
}